

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_enum_support.cpp
# Opt level: O0

Am_Value __thiscall Am_Enum_Support::From_String(Am_Enum_Support *this,char *string)

{
  int iVar1;
  char *in_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value aVar2;
  Am_Value AVar3;
  int local_24;
  int i;
  char *string_local;
  Am_Enum_Support *this_local;
  
  local_24 = 0;
  do {
    if (*(int *)(string + 0x18) <= local_24) {
      Am_Value::Am_Value((Am_Value *)this,&Am_No_Value);
      aVar2 = extraout_RDX_00;
LAB_002e86ac:
      AVar3.value.wrapper_value = aVar2.wrapper_value;
      AVar3._0_8_ = this;
      return AVar3;
    }
    iVar1 = strcmp(in_RDX,*(char **)(*(long *)(string + 0x10) + (long)local_24 * 8));
    if (iVar1 == 0) {
      Am_Value::Am_Value((Am_Value *)this,(long)local_24,*(Am_Value_Type *)(string + 0x1c));
      aVar2 = extraout_RDX;
      goto LAB_002e86ac;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

Am_Value
Am_Enum_Support::From_String(const char *string) const
{
  int i;
  for (i = 0; i < number; ++i) {
    if (!strcmp(string, item[i]))
      return Am_Value(i, type);
  }
  return Am_No_Value;
}